

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

char * get_battle_condition(CHAR_DATA *victim,int percent)

{
  bool bVar1;
  int in_ESI;
  CHAR_DATA *in_RDI;
  AFFECT_DATA *b_af_1;
  AFFECT_DATA *b_af;
  AFFECT_DATA *local_28;
  int local_14;
  char *local_8;
  
  bVar1 = is_affected(in_RDI,(int)gsn_bluff);
  local_14 = in_ESI;
  if (bVar1) {
    for (local_28 = in_RDI->affected;
        (local_28 != (AFFECT_DATA *)0x0 && (local_28->type != gsn_bluff)); local_28 = local_28->next
        ) {
    }
    local_14 = local_28->modifier * 3 * in_ESI;
  }
  if (local_14 < 100) {
    if (local_14 < 0x5a) {
      if (local_14 < 0x4b) {
        if (local_14 < 0x32) {
          if (local_14 < 0x1e) {
            if (local_14 < 0xf) {
              if (local_14 < 0) {
                local_8 = "is nearly dead.";
              }
              else {
                local_8 = "is convulsing on the ground.";
              }
            }
            else {
              local_8 = "is writhing in pain.";
            }
          }
          else {
            local_8 = "is gushing blood.";
          }
        }
        else {
          local_8 = "is covered in bleeding wounds.";
        }
      }
      else {
        local_8 = "has some small wounds.";
      }
    }
    else {
      local_8 = "has a few scratches.";
    }
  }
  else {
    local_8 = "is in perfect condition.";
  }
  return local_8;
}

Assistant:

const char *get_battle_condition(CHAR_DATA *victim, int percent)
{
	AFFECT_DATA *b_af = nullptr;

	if (is_affected(victim, gsn_bluff))
	{
		AFFECT_DATA *b_af = nullptr;

		for (b_af = victim->affected; b_af != nullptr; b_af = b_af->next)
		{
			if (b_af->type == gsn_bluff)
				break;
		}

		percent *= (b_af->modifier * 3);
	}

	if (percent >= 100)
		return "is in perfect condition.";
	else if (percent >= 90)
		return "has a few scratches.";
	else if (percent >= 75)
		return "has some small wounds.";
	else if (percent >= 50)
		return "is covered in bleeding wounds.";
	else if (percent >= 30)
		return "is gushing blood.";
	else if (percent >= 15)
		return "is writhing in pain.";
	else if (percent >= 0)
		return "is convulsing on the ground.";
	else
		return "is nearly dead.";
}